

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amapLib.c
# Opt level: O1

void Amap_LibWriteGate(FILE *pFile,Amap_Gat_t *pGate,int fPrintDsd)

{
  Amap_Pin_t *pPin;
  
  fwrite("GATE ",5,1,(FILE *)pFile);
  fprintf((FILE *)pFile,"%12s ",pGate->pName);
  fprintf((FILE *)pFile,"%10.2f   ",pGate->dArea);
  fprintf((FILE *)pFile,"%s=%s;\n",pGate->pOutName,pGate->pForm);
  if (fPrintDsd != 0) {
    if (pGate->pFunc == (uint *)0x0) {
      puts("Truth table is not available.");
    }
    else {
      Kit_DsdPrintFromTruth(pGate->pFunc,(uint)(byte)pGate->field_0x3b);
    }
  }
  if (0xffffff < *(uint *)&pGate->field_0x38) {
    pPin = (Amap_Pin_t *)(pGate + 1);
    do {
      Amap_LibWritePin(pFile,pPin);
      pPin = pPin + 1;
    } while (pPin < (Amap_Pin_t *)(pGate + 1) + (byte)pGate->field_0x3b);
  }
  return;
}

Assistant:

void Amap_LibWriteGate( FILE * pFile, Amap_Gat_t * pGate, int fPrintDsd )
{
    Amap_Pin_t * pPin;
    fprintf( pFile, "GATE " );
    fprintf( pFile, "%12s ",      pGate->pName );
    fprintf( pFile, "%10.2f   ",  pGate->dArea );
    fprintf( pFile, "%s=%s;\n",   pGate->pOutName,    pGate->pForm );
    if ( fPrintDsd )
    {
        if ( pGate->pFunc == NULL )
            printf( "Truth table is not available.\n" );
        else
            Kit_DsdPrintFromTruth( pGate->pFunc, pGate->nPins );
    }
    Amap_GateForEachPin( pGate, pPin )
        Amap_LibWritePin( pFile, pPin );
}